

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mode.h
# Opt level: O2

uint sfc::default_palette_count_for_mode(Mode mode)

{
  uint uVar1;
  
  uVar1 = 0;
  if (mode - snes < 0xf) {
    uVar1 = *(uint *)(&DAT_00150578 + (ulong)(mode - snes) * 4);
  }
  return uVar1;
}

Assistant:

constexpr unsigned default_palette_count_for_mode(Mode mode) {
  switch (mode) {
  case Mode::snes_mode7:
  case Mode::gb:
  case Mode::gba_affine:
    return 1;
  case Mode::ngp:
  case Mode::sms:
    return 2;
  case Mode::md:
    return 4;
  case Mode::snes:
  case Mode::gbc:
    return 8;
  case Mode::gba:
  case Mode::pce:
  case Mode::pce_sprite:
  case Mode::ws:
  case Mode::wsc:
  case Mode::wsc_packed:
  case Mode::ngpc:
    return 16;
  default:
    return 0;
  }
}